

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

value_type * __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::
CreateValueTypeInternal
          (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  Arena *this_00;
  pointer pcVar1;
  value_type *object;
  
  if (this->arena_ == (Arena *)0x0) {
    object = (value_type *)operator_new(0x28);
    (object->first)._M_dataplus._M_p = (pointer)&(object->first).field_2;
    pcVar1 = (key->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)object,pcVar1,pcVar1 + key->_M_string_length);
    object->second = 0;
  }
  else {
    object = (value_type *)
             Arena::AllocateAligned(this->arena_,(type_info *)&unsigned_char::typeinfo,0x28);
    this_00 = this->arena_;
    (object->first)._M_dataplus._M_p = (pointer)&(object->first).field_2;
    (object->first)._M_string_length = 0;
    (object->first).field_2._M_local_buf[0] = '\0';
    Arena::OwnDestructor<std::__cxx11::string>
              (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)object);
    object->second = 0;
    std::__cxx11::string::_M_assign((string *)object);
  }
  return object;
}

Assistant:

value_type* CreateValueTypeInternal(const Key& key) {
    if (arena_ == NULL) {
      return new value_type(key);
    } else {
      value_type* value = reinterpret_cast<value_type*>(
          Arena::CreateArray<uint8>(arena_, sizeof(value_type)));
      Arena::CreateInArenaStorage(const_cast<Key*>(&value->first), arena_);
      Arena::CreateInArenaStorage(&value->second, arena_);
      const_cast<Key&>(value->first) = key;
      return value;
    }
  }